

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O1

Container * __thiscall
IceCore::Container::FindNext(Container *this,udword *entry,FindMode find_mode)

{
  uint uVar1;
  Container *pCVar2;
  undefined1 *puVar3;
  Container *pCVar4;
  uint uVar5;
  ulong uVar6;
  Container *pCVar7;
  bool bVar8;
  
  uVar1 = this->mCurNbEntries;
  puVar3 = (undefined1 *)(ulong)uVar1;
  bVar8 = puVar3 != (undefined1 *)0x0;
  pCVar4 = this;
  if (bVar8) {
    if (*this->mEntries == *entry) {
      bVar8 = true;
      pCVar4 = (Container *)0x1;
    }
    else {
      pCVar2 = (Container *)0x0;
      do {
        pCVar7 = pCVar2;
        if ((Container *)(puVar3 + -1) == pCVar7) break;
        pCVar4 = (Container *)((long)&pCVar7->mMaxNbEntries + 1);
        pCVar2 = pCVar4;
      } while (this->mEntries[(long)((long)&pCVar7->mMaxNbEntries + 1)] != *entry);
      bVar8 = (undefined1 *)((long)&pCVar7->mMaxNbEntries + 1U) < puVar3;
      pCVar4 = (Container *)(ulong)((int)pCVar4 + 1);
    }
  }
  if (bVar8) {
    uVar5 = 0;
    if (find_mode != FIND_WRAP) {
      uVar5 = uVar1 - 1;
    }
    uVar6 = (ulong)uVar5;
    if ((uint)pCVar4 != uVar1) {
      uVar6 = (ulong)pCVar4 & 0xffffffff;
    }
    *entry = this->mEntries[uVar6];
  }
  return this;
}

Assistant:

Container& Container::FindNext(udword& entry, FindMode find_mode)
{
	udword Location;
	if(Contains(entry, &Location))
	{
		Location++;
		if(Location==mCurNbEntries)	Location = find_mode==FIND_WRAP ? 0 : mCurNbEntries-1;
		entry = mEntries[Location];
	}
	return *this;
}